

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_impl_avx2.c
# Opt level: O0

uint aom_sad128x64_avg_avx2
               (uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride,uint8_t *second_pred
               )

{
  uint second_pred_stride;
  uint uVar1;
  uint32_t sum;
  uint half_width;
  uint8_t *in_stack_000000b8;
  int in_stack_000000c0;
  int in_stack_000000c4;
  uint8_t *in_stack_000000c8;
  int in_stack_000000d4;
  uint8_t *in_stack_000000d8;
  int in_stack_ffffffffffffffd0;
  
  second_pred_stride =
       sad_w64_avg_avx2(in_stack_000000d8,in_stack_000000d4,in_stack_000000c8,in_stack_000000c4,
                        in_stack_000000c0,in_stack_000000b8,in_stack_ffffffffffffffd0);
  uVar1 = sad_w64_avg_avx2(in_stack_000000d8,in_stack_000000d4,in_stack_000000c8,in_stack_000000c4,
                           in_stack_000000c0,in_stack_000000b8,second_pred_stride);
  return uVar1 + second_pred_stride;
}

Assistant:

unsigned int aom_sad128x64_avg_avx2(const uint8_t *src_ptr, int src_stride,
                                    const uint8_t *ref_ptr, int ref_stride,
                                    const uint8_t *second_pred) {
  unsigned int half_width = 64;
  uint32_t sum = sad_w64_avg_avx2(src_ptr, src_stride, ref_ptr, ref_stride, 64,
                                  second_pred, 128);
  src_ptr += half_width;
  ref_ptr += half_width;
  second_pred += half_width;
  sum += sad_w64_avg_avx2(src_ptr, src_stride, ref_ptr, ref_stride, 64,
                          second_pred, 128);
  return sum;
}